

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReader::readFaceData
          (PtexReader *this,FilePos pos,FaceDataHeader fdh,Res res,int levelid,FaceData **face)

{
  bool bVar1;
  Encoding EVar2;
  int iVar3;
  int iVar4;
  uint32_t zipsize;
  DataType DVar5;
  reference data;
  DataType *pDVar6;
  undefined1 *puVar7;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  PtexReader *in_stack_fffffffffffffe20;
  FaceDataHeader *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  PtexReader *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe54;
  Res resArg;
  undefined1 *local_160;
  char *tmp;
  bool useNew;
  PackedFace *pf;
  int unpackedSize;
  int npixels;
  int vw;
  int uw;
  TiledFace *tf;
  uint32_t tileheadersize;
  Res tileres;
  ConstantFace *cf;
  size_t local_60;
  size_t newMemUsed;
  FaceData *newface;
  AutoMutex locker;
  FaceData **face_local;
  int levelid_local;
  FilePos pos_local;
  PtexReader *this_local;
  Res res_local;
  size_t sStack_18;
  FaceDataHeader fdh_local;
  
  pDVar6 = (DataType *)&stack0xfffffffffffffe18;
  puVar7 = &stack0xfffffffffffffe18;
  this_local._2_2_ = res;
  this_local._4_4_ = fdh.data;
  AutoLock<Ptex::v2_4::Mutex>::AutoLock
            ((AutoLock<Ptex::v2_4::Mutex> *)in_stack_fffffffffffffe20,
             (Mutex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  if (*face == (FaceData *)0x0) {
    newMemUsed = 0;
    local_60 = 0;
    seek(in_stack_fffffffffffffe20,CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    EVar2 = FaceDataHeader::encoding((FaceDataHeader *)((long)&this_local + 4));
    if (EVar2 == enc_constant) {
      newMemUsed = (size_t)operator_new(0x18);
      ConstantFace::ConstantFace
                ((ConstantFace *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      local_60 = (long)this->_pixelsize + 0x18;
      _tileheadersize = (PackedFace *)newMemUsed;
      PackedFace::data((PackedFace *)newMemUsed);
      readBlock(in_stack_fffffffffffffe38,
                (void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
      pDVar6 = (DataType *)&stack0xfffffffffffffe18;
      if (((levelid == 0) &&
          (pDVar6 = (DataType *)&stack0xfffffffffffffe18, (this->_premultiply & 1U) != 0)) &&
         (bVar1 = Header::hasAlpha(&this->_header), pDVar6 = (DataType *)&stack0xfffffffffffffe18,
         bVar1)) {
        PackedFace::data(_tileheadersize);
        datatype(this);
        PtexUtils::multalpha
                  ((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   (DataType)in_stack_fffffffffffffe28,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),(int)in_stack_fffffffffffffe20);
        pDVar6 = (DataType *)&stack0xfffffffffffffe18;
      }
    }
    else if (EVar2 - enc_zipped < 2) {
      iVar3 = Res::u((Res *)((long)&this_local + 2));
      resArg = SUB42((uint)in_stack_fffffffffffffe54 >> 0x10,0);
      iVar4 = Res::v((Res *)((long)&this_local + 2));
      iVar3 = this->_pixelsize * iVar3 * iVar4;
      newMemUsed = (size_t)operator_new(0x18);
      PackedFace::PackedFace
                ((PackedFace *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),resArg,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
      local_60 = (long)iVar3 + 0x18;
      if (0x4000 < iVar3) {
        local_160 = (undefined1 *)operator_new__((long)iVar3);
        pDVar6 = (DataType *)&stack0xfffffffffffffe18;
      }
      else {
        pDVar6 = (DataType *)(&stack0xfffffffffffffe18 + -((long)iVar3 + 0xfU & 0xfffffffffffffff0))
        ;
        local_160 = (undefined1 *)pDVar6;
      }
      pDVar6[-2] = 0x110cac;
      pDVar6[-1] = dt_uint8;
      zipsize = FaceDataHeader::blocksize((FaceDataHeader *)((long)&this_local + 4));
      pDVar6[-2] = 0x110cd3;
      pDVar6[-1] = dt_uint8;
      readZipBlock(this,local_160,zipsize,iVar3);
      pDVar6[-2] = 0x110cde;
      pDVar6[-1] = dt_uint8;
      EVar2 = FaceDataHeader::encoding((FaceDataHeader *)((long)&this_local + 4));
      if (EVar2 == enc_diffzipped) {
        pDVar6[-2] = 0x110d17;
        pDVar6[-1] = dt_uint8;
        datatype(this);
        pDVar6[-2] = 0x110d37;
        pDVar6[-1] = dt_uint8;
        PtexUtils::decodeDifference(*(void **)(pDVar6 + 2),pDVar6[1],*pDVar6);
      }
      pDVar6[-2] = 0x110d83;
      pDVar6[-1] = dt_uint8;
      DVar5 = datatype(this);
      pDVar6[-2] = 0x110d96;
      pDVar6[-1] = dt_uint8;
      DataSize(DVar5);
      pDVar6[-2] = 0x110dd7;
      pDVar6[-1] = dt_uint8;
      PackedFace::data((PackedFace *)newMemUsed);
      pDVar6[-2] = 0x110e01;
      pDVar6[-1] = dt_uint8;
      DVar5 = datatype(this);
      pDVar6[-2] = (uint)(this->_header).nchannels;
      pDVar6[-4] = DVar5;
      pDVar6[-6] = 0x110e59;
      pDVar6[-5] = dt_uint8;
      PtexUtils::interleave
                (*(void **)(pDVar6 + 6),pDVar6[5],pDVar6[4],pDVar6[3],*(void **)pDVar6,pDVar6[-1],
                 pDVar6[10],pDVar6[0xc]);
      if ((levelid == 0) && ((this->_premultiply & 1U) != 0)) {
        pDVar6[-2] = 0x110e8d;
        pDVar6[-1] = dt_uint8;
        bVar1 = Header::hasAlpha(&this->_header);
        if (bVar1) {
          pDVar6[-2] = 0x110ead;
          pDVar6[-1] = dt_uint8;
          PackedFace::data((PackedFace *)newMemUsed);
          pDVar6[-2] = 0x110ece;
          pDVar6[-1] = dt_uint8;
          datatype(this);
          pDVar6[-2] = 0x110f03;
          pDVar6[-1] = dt_uint8;
          PtexUtils::multalpha(*(void **)(pDVar6 + 6),pDVar6[5],pDVar6[4],pDVar6[3],pDVar6[2]);
        }
      }
      if ((0x4000 < iVar3) && (local_160 != (undefined1 *)0x0)) {
        pDVar6[-2] = 0x110f30;
        pDVar6[-1] = dt_uint8;
        operator_delete__(local_160);
      }
    }
    else if (EVar2 == enc_tiled) {
      Res::Res((Res *)((long)&tf + 6));
      readBlock(in_stack_fffffffffffffe38,
                (void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
      readBlock(in_stack_fffffffffffffe38,
                (void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
      newMemUsed = (size_t)operator_new(0x88);
      TiledFace::TiledFace
                ((TiledFace *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (PtexReader *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 SUB42((uint)in_stack_fffffffffffffe54 >> 0x10,0),SUB42(in_stack_fffffffffffffe54,0)
                 ,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      local_60 = TiledFace::memUsed((TiledFace *)in_stack_fffffffffffffe20);
      data = std::vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>::
             operator[]((vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                         *)(newMemUsed + 0x58),0);
      readZipBlock(this,data,(int)tf,*(int *)(newMemUsed + 0x2c) << 2);
      tell(this);
      std::vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>::
      operator[]((vector<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_> *)
                 (newMemUsed + 0x58),0);
      std::vector<long,_std::allocator<long>_>::operator[]
                ((vector<long,_std::allocator<long>_> *)(newMemUsed + 0x70),0);
      computeOffsets((PtexReader *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     (FilePos)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                     in_stack_fffffffffffffe28,(FilePos *)in_stack_fffffffffffffe20);
      pDVar6 = (DataType *)&stack0xfffffffffffffe18;
    }
    if (newMemUsed == 0) {
      *(undefined8 *)((long)pDVar6 + -8) = 0x110f49;
      newMemUsed = (size_t)errorData(*(PtexReader **)((long)pDVar6 + 0x28),
                                     *(bool *)((long)pDVar6 + 0x27));
    }
    sStack_18 = newMemUsed;
    *face = (FaceData *)newMemUsed;
    *(undefined8 *)((long)pDVar6 + -8) = 0x110f8b;
    increaseMemUsed(this,local_60);
    puVar7 = (undefined1 *)pDVar6;
  }
  *(undefined8 *)(puVar7 + -8) = 0x110f9d;
  AutoLock<Ptex::v2_4::Mutex>::~AutoLock(*(AutoLock<Ptex::v2_4::Mutex> **)(puVar7 + -8));
  return;
}

Assistant:

void PtexReader::readFaceData(FilePos pos, FaceDataHeader fdh, Res res, int levelid,
                              FaceData*& face)
{
    AutoMutex locker(readlock);
    if (face) {
        return;
    }

    // keep new face local until fully initialized
    FaceData* newface = 0;
    size_t newMemUsed = 0;

    seek(pos);
    switch (fdh.encoding()) {
    case enc_constant:
        {
            ConstantFace* cf = new ConstantFace(_pixelsize);
            newface = cf;
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
            readBlock(cf->data(), _pixelsize);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(cf->data(), 1, datatype(),
                                     _header.nchannels, _header.alphachan);
        }
        break;
    case enc_tiled:
        {
            Res tileres;
            readBlock(&tileres, sizeof(tileres));
            uint32_t tileheadersize;
            readBlock(&tileheadersize, sizeof(tileheadersize));
            TiledFace* tf = new TiledFace(this, res, tileres, levelid);
            newface = tf;
            newMemUsed = tf->memUsed();
            readZipBlock(&tf->_fdh[0], tileheadersize, FaceDataHeaderSize * tf->_ntiles);
            computeOffsets(tell(), tf->_ntiles, &tf->_fdh[0], &tf->_offsets[0]);
        }
        break;
    case enc_zipped:
    case enc_diffzipped:
        {
            int uw = res.u(), vw = res.v();
            int npixels = uw * vw;
            int unpackedSize = _pixelsize * npixels;
            PackedFace* pf = new PackedFace(res, _pixelsize, unpackedSize);
            newface = pf;
            newMemUsed = sizeof(PackedFace) + unpackedSize;
            bool useNew = unpackedSize > AllocaMax;
            char* tmp = useNew ? new char [unpackedSize] : (char*) alloca(unpackedSize);
            readZipBlock(tmp, fdh.blocksize(), unpackedSize);
            if (fdh.encoding() == enc_diffzipped)
                PtexUtils::decodeDifference(tmp, unpackedSize, datatype());
            PtexUtils::interleave(tmp, uw * DataSize(datatype()), uw, vw,
                                  pf->data(), uw * _pixelsize,
                                  datatype(), _header.nchannels);
            if (levelid==0 && _premultiply && _header.hasAlpha())
                PtexUtils::multalpha(pf->data(), npixels, datatype(),
                                     _header.nchannels, _header.alphachan);
            if (useNew) delete [] tmp;
        }
        break;
    }

    if (!newface) newface = errorData();

    AtomicStore(&face, newface);
    increaseMemUsed(newMemUsed);
}